

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

void recff_cdata_arith(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  CType *pCVar2;
  TValue *pTVar3;
  CType *pCVar4;
  ushort uVar5;
  IRRef1 IVar6;
  IRType IVar7;
  CTypeID CVar8;
  TRef TVar9;
  TRef TVar10;
  TRef TVar11;
  CTSize CVar12;
  GCcdata *pGVar13;
  ulong uVar14;
  CType *pCVar15;
  cTValue *tv;
  TRef *pTVar16;
  ushort uVar17;
  ushort uVar18;
  IROpT IVar19;
  uint uVar20;
  int iVar21;
  CTState *cts;
  GCobj *o;
  ulong uVar22;
  int32_t iVar23;
  TRef tr;
  IRRef1 IVar24;
  CTState *cts_00;
  uint uVar25;
  long lVar26;
  TRef sp [2];
  CType *s [2];
  CTSize ofs;
  ulong local_38;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(J->L->glref).ptr32 + 0x194);
  cts->L = J->L;
  uVar1 = rd->data;
  for (lVar26 = 0; pCVar15 = s[0], lVar26 != 2; lVar26 = lVar26 + 1) {
    uVar25 = J->base[lVar26];
    if (uVar25 == 0) {
LAB_00154558:
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    uVar20 = uVar25 & 0x1f000000;
    if (uVar20 == 0) {
      if ((uVar1 & 0xfffffffc) != 4) goto LAB_00154558;
      uVar25 = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
      pCVar15 = cts->tab + 0x11;
    }
    else {
      IVar24 = (IRRef1)uVar25;
      if (uVar20 == 0xa000000) {
        pGVar13 = argv2cdata(J,uVar25,rd->argv + lVar26);
        local_38 = (ulong)pGVar13->ctypeid;
        pCVar2 = cts->tab;
        uVar25 = pCVar2[local_38].info;
        pCVar15 = pCVar2 + local_38;
        IVar7 = crec_ct2irt(cts,pCVar15);
        pCVar4 = s[0];
        uVar25 = uVar25 >> 0x1c;
        uVar18 = (ushort)IVar7;
        if (uVar25 == 2) {
          (J->fold).ins.field_0.ot = uVar18 | 0x4400;
          (J->fold).ins.field_0.op1 = IVar24;
          (J->fold).ins.field_0.op2 = 0xf;
          uVar25 = lj_opt_fold(J);
          uVar20 = pCVar15->info;
          if ((uVar20 & 0xf0800000) == 0x20800000) {
            uVar14 = (ulong)((uVar20 & 0xffff) << 4);
            uVar20 = *(uint *)((long)&cts->tab->info + uVar14);
            pCVar15 = (CType *)((long)&cts->tab->info + uVar14);
            IVar7 = crec_ct2irt(cts,pCVar15);
          }
LAB_00153ae6:
          if ((uVar20 & 0xf0000000) == 0x50000000) {
            uVar14 = (ulong)((uVar20 & 0xffff) << 4);
            pCVar15 = (CType *)((long)&cts->tab->info + uVar14);
            uVar20 = *(uint *)((long)&cts->tab->info + uVar14);
          }
          if (uVar20 < 0x10000000) {
            if (IVar7 != IRT_CDATA) {
              (J->fold).ins.field_0.ot = (ushort)IVar7 | 0x4500;
              (J->fold).ins.field_0.op1 = (IRRef1)uVar25;
              (J->fold).ins.field_0.op2 = 0;
              goto LAB_00153d53;
            }
            uVar25 = 0;
          }
        }
        else if (IVar7 - IRT_I64 < 2) {
          (J->fold).ins.field_0.ot = uVar18 | 0x4400;
          (J->fold).ins.field_0.op1 = IVar24;
          (J->fold).ins.field_0.op2 = 0x11;
LAB_00153d53:
          uVar25 = lj_opt_fold(J);
        }
        else if (IVar7 - IRT_IGC < 2) {
          (J->fold).ins.field_0.ot = uVar18 | 0x4400;
          (J->fold).ins.field_0.op1 = IVar24;
          (J->fold).ins.field_0.op2 = 0x10;
          uVar25 = lj_opt_fold(J);
          if ((pCVar15->info & 0xf0000000) == 0x50000000) {
            pCVar15 = (CType *)((long)&cts->tab->info + (ulong)((pCVar15->info & 0xffff) << 4));
          }
        }
        else {
          if (uVar25 != 6) {
            TVar9 = lj_ir_kint64(J,8);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar24;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
            uVar25 = lj_opt_fold(J);
            uVar20 = pCVar15->info;
            goto LAB_00153ae6;
          }
          (J->fold).ins.field_0.op1 = IVar24;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4409000f;
          uVar25 = lj_opt_fold(J);
          CVar8 = lj_ctype_intern(cts,(uint)local_38 | 0x20030000,8);
          pCVar15 = cts->tab + CVar8;
          if (lVar26 != 0) {
            s[0] = (CType *)((long)&cts->tab->info + ((long)pCVar4 - (long)pCVar2 & 0xffffffff0U));
          }
        }
      }
      else {
        pCVar15 = cts->tab;
        if ((uVar25 >> 0x18 & 0x1f) - 0xf < 5) {
          pCVar15 = pCVar15 + 9;
        }
        else if (uVar20 == 0xe000000) {
          pCVar15 = pCVar15 + 0xe;
        }
        else if (uVar20 == 0x4000000) {
          iVar21 = 1 - (int)lVar26;
          pGVar13 = argv2cdata(J,*(TRef *)((long)J->base + (ulong)(uint)(iVar21 * 4)),
                               (cTValue *)((ulong)(uint)(iVar21 * 8) + (long)rd->argv));
          pCVar15 = cts->tab + pGVar13->ctypeid;
          uVar25 = cts->tab[pGVar13->ctypeid].info >> 0x1c;
          if (uVar25 == 2) {
            TVar9 = lj_ir_kint64(J,0x10);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar24;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
            uVar25 = lj_opt_fold(J);
          }
          else {
            if (uVar25 != 5) {
LAB_00154563:
              lj_trace_err(J,LJ_TRERR_BADTYPE);
            }
            o = (GCobj *)(ulong)rd->argv[lVar26].u32.lo;
            pCVar15 = lj_ctype_getfieldq(cts,pCVar15,&o->str,&ofs,(CTInfo *)0x0);
            if ((pCVar15 == (CType *)0x0) || ((pCVar15->info & 0xf0000000) != 0xb0000000))
            goto LAB_00154563;
            TVar9 = lj_ir_kgc(J,o,IRT_STR);
            (J->fold).ins.field_0.ot = 0x884;
            (J->fold).ins.field_0.op1 = IVar24;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
            lj_opt_fold(J);
            pCVar15 = cts->tab + (ushort)pCVar15->info;
            uVar25 = lj_ir_kint(J,ofs);
          }
        }
        else {
          pCVar15 = pCVar15 + 0x11;
          uVar25 = 0;
        }
      }
    }
    s[lVar26] = pCVar15;
    sp[lVar26] = uVar25;
  }
  if (((uVar1 == 5) || (uVar1 == 8)) || (uVar14 = (ulong)sp[0], uVar14 == 0)) {
LAB_00154394:
    pTVar16 = J->base;
    if (*pTVar16 != 0) {
      if ((rd->argv->field_2).it == 0xfffffff5) {
        pGVar13 = argv2cdata(J,*pTVar16,rd->argv);
        uVar1 = cts->tab[pGVar13->ctypeid].info;
        uVar25 = (uint)pGVar13->ctypeid;
        if ((uVar1 & 0xf0000000) == 0x20000000) {
          uVar25 = uVar1 & 0xffff;
        }
        tv = lj_ctype_meta(cts,uVar25,rd->data);
        if (tv == (cTValue *)0x0) {
          pTVar16 = J->base;
          goto LAB_0015440a;
        }
LAB_00154469:
        if ((tv->field_2).it == 0xfffffff7) {
          crec_tailcall(J,rd,tv);
          return;
        }
        goto LAB_00154570;
      }
LAB_0015440a:
      if ((pTVar16[1] != 0) && (*(int *)((long)rd->argv + 0xc) == -0xb)) {
        pGVar13 = argv2cdata(J,pTVar16[1],rd->argv + 1);
        uVar1 = cts->tab[pGVar13->ctypeid].info;
        uVar25 = (uint)pGVar13->ctypeid;
        if ((uVar1 & 0xf0000000) == 0x20000000) {
          uVar25 = uVar1 & 0xffff;
        }
        tv = lj_ctype_meta(cts,uVar25,rd->data);
        if (tv != (cTValue *)0x0) goto LAB_00154469;
      }
    }
    if (rd->data != 4) {
LAB_00154570:
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    uVar14 = (ulong)sp[0];
    TVar10 = 0x1007ffe;
    if (((sp[0] == 0) || (uVar22 = (ulong)sp[1], sp[1] == 0)) ||
       (uVar18 = 0x889, 0xfffffff < s[1]->info == s[0]->info < 0x10000000)) goto LAB_001544f6;
  }
  else {
    uVar22 = (ulong)sp[1];
    if (((uVar22 != 0) && (uVar25 = s[0]->info, uVar25 < 0x10000000)) &&
       (uVar20 = s[1]->info, uVar20 < 0x10000000)) {
      uVar18 = 0x16;
      iVar23 = 0xc;
      if ((((uVar25 >> 0x17 & 1) == 0) || (s[0]->size != 8)) &&
         (((uVar20 >> 0x17 & 1) == 0 || (s[1]->size != 8)))) {
        iVar23 = 0xb;
        uVar18 = 0x15;
        if (((((9 < uVar1) || (((uVar20 | uVar25) >> 0x1a & 1) != 0)) || (s[0]->size != 4)) ||
            (s[1]->size != 4)) ||
           (((((uVar20 ^ uVar25) >> 0x17 & 1) != 0 &&
             (((short)sp[1] < 0 || ((J->cur).ir[sp[1] & 0x7fff].i < 0)))) &&
            (((short)sp[0] < 0 || (uVar25 = uVar20, (J->cur).ir[sp[0] & 0x7fff].i < 0))))))
        goto LAB_00153f60;
        uVar18 = ((uVar25 >> 0x17 & 1) != 0) + 0x13;
      }
      else {
LAB_00153f60:
        for (lVar26 = 0; TVar9 = sp[0], lVar26 != 2; lVar26 = lVar26 + 1) {
          uVar25 = sp[lVar26];
          uVar20 = uVar25 >> 0x18 & 0x1f;
          if (uVar20 - 0xd < 2) {
            uVar17 = (short)uVar20 + uVar18 * 0x20 + 0x1000;
LAB_00153fba:
            (J->fold).ins.field_0.ot = uVar18 + 0x5900;
            (J->fold).ins.field_0.op1 = (IRRef1)uVar25;
            (J->fold).ins.field_0.op2 = uVar17;
            TVar9 = lj_opt_fold(J);
            sp[lVar26] = TVar9;
          }
          else if (1 < uVar20 - 0x15) {
            uVar17 = ((ushort)(s[lVar26]->info >> 0xc) & 0x800 | uVar18 * 0x20) ^ 0x813;
            goto LAB_00153fba;
          }
        }
        if (9 < uVar1) {
          uVar14 = (ulong)sp[0];
          uVar22 = (ulong)sp[1];
          (J->fold).ins.field_0.ot = (short)(uVar1 << 8) + uVar18 + 0x1f00;
          (J->fold).ins.field_0.op1 = (IRRef1)sp[0];
          (J->fold).ins.field_0.op2 = (IRRef1)sp[1];
          TVar10 = lj_opt_fold(J);
          TVar11 = lj_ir_kint(J,iVar23);
          (J->fold).ins.field_0.ot = 0x528a;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
          TVar10 = lj_opt_fold(J);
          if (TVar10 != 0) goto LAB_001544f6;
          if (TVar9 == 0) goto LAB_00154394;
          goto LAB_001540b1;
        }
      }
      uVar17 = 0x800;
      if (uVar1 != 4) {
        uVar5 = (ushort)(uVar1 != 6) * 0x200;
        uVar17 = uVar5 + 0x400;
        if ((uVar18 & 0xfffd) != 0x14) {
          uVar17 = uVar5;
        }
      }
      uVar18 = uVar17 | uVar18 | 0x80;
      uVar14 = (ulong)sp[0];
      uVar22 = (ulong)sp[1];
      goto LAB_001544d1;
    }
LAB_001540b1:
    TVar9 = (TRef)uVar22;
    if (TVar9 == 0) goto LAB_00154394;
    cts_00 = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
    uVar25 = pCVar15->info;
    TVar10 = (TRef)uVar14;
    if ((uVar25 & 0xf0000000) != 0x20000000 && (uVar25 & 0xfc000000) != 0x30000000) {
      if ((0xfffffff < uVar25 || uVar1 != 10) ||
         (uVar25 = s[1]->info, pCVar15 = s[1], TVar11 = TVar9,
         (uVar25 & 0xf0000000) != 0x20000000 && (uVar25 & 0xfc000000) != 0x30000000))
      goto LAB_00154394;
LAB_00154245:
      sp[1] = TVar10;
      sp[0] = TVar11;
      uVar20 = (uint)(uVar14 >> 0x18) & 0x1f;
      CVar12 = lj_ctype_size(cts_00,uVar25 & 0xffff);
      if (uVar20 - 0xd < 2) {
        uVar18 = (ushort)uVar20 | 0x12a0;
LAB_001542ae:
        (J->fold).ins.field_0.ot = 0x5915;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar14;
        (J->fold).ins.field_0.op2 = uVar18;
        TVar10 = lj_opt_fold(J);
        uVar14 = (ulong)TVar10;
      }
      else if (1 < uVar20 - 0x15) {
        uVar18 = (ushort)(uVar14 >> 0xd) & 0x800 | 0x2b3;
        goto LAB_001542ae;
      }
      TVar10 = lj_ir_kint64(J,(ulong)CVar12);
      (J->fold).ins.field_0.ot = 0x2b15;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar14;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
      TVar10 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = (short)(uVar1 << 8) + 0x1f09;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
      TVar9 = lj_opt_fold(J);
      IVar24 = (IRRef1)TVar9;
      CVar8 = lj_ctype_intern(cts_00,(ushort)pCVar15->info | 0x20030000,8);
      TVar9 = lj_ir_kint(J,CVar8);
      IVar6 = (IRRef1)TVar9;
      IVar19 = 0x528a;
LAB_00154363:
      (J->fold).ins.field_0.ot = IVar19;
      (J->fold).ins.field_0.op1 = IVar6;
      (J->fold).ins.field_0.op2 = IVar24;
      TVar10 = lj_opt_fold(J);
      if (TVar10 != 0) goto LAB_001544f6;
      goto LAB_00154394;
    }
    if ((0xb < uVar1) ||
       (((0x8d0U >> (uVar1 & 0x1f) & 1) == 0 ||
        ((s[1]->info & 0xf0000000) != 0x20000000 && (s[1]->info & 0xfc000000) != 0x30000000)))) {
      if (((uVar1 & 0xfffffffe) == 10) &&
         (uVar14 = uVar22, TVar9 = TVar10, TVar11 = sp[0], TVar10 = sp[1], s[1]->info < 0x10000000))
      goto LAB_00154245;
      goto LAB_00154394;
    }
    if (uVar1 == 4) {
      uVar18 = 0x889;
    }
    else {
      if (uVar1 == 0xb) {
        CVar12 = lj_ctype_size(cts_00,uVar25 & 0xffff);
        if ((CVar12 ^ CVar12 - 1) <= CVar12 - 1) goto LAB_00154394;
        (J->fold).ins.field_0.ot = 0x2a15;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar14;
        (J->fold).ins.field_0.op2 = (IRRef1)uVar22;
        TVar9 = lj_opt_fold(J);
        iVar23 = 0x1f;
        if (CVar12 != 0) {
          for (; CVar12 >> iVar23 == 0; iVar23 = iVar23 + -1) {
          }
        }
        TVar10 = lj_ir_kint(J,iVar23);
        (J->fold).ins.field_0.ot = 0x2615;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
        TVar9 = lj_opt_fold(J);
        IVar6 = (IRRef1)TVar9;
        IVar24 = 0x1d5;
        IVar19 = 0x590e;
        goto LAB_00154363;
      }
      uVar18 = (ushort)(uVar1 != 6) << 9 | 0x489;
    }
  }
LAB_001544d1:
  (J->fold).ins.field_0.ot = uVar18;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar14;
  (J->fold).ins.field_0.op2 = (IRRef1)uVar22;
  J->postproc = LJ_POST_FIXGUARD;
  TVar10 = 0x2007ffd;
LAB_001544f6:
  *J->base = TVar10;
  if (((J->postproc == LJ_POST_FIXGUARD) &&
      (pTVar3 = J->L->base, ((ulong)*pTVar3 & 0x700000000) == 0x200000000)) &&
     ((-1 < (char)(J->guardemit).irt &&
      (uVar14 = (ulong)*(uint *)((long)pTVar3 + -0xc), (*(uint *)(uVar14 - 4) & 0xfc) < 0xc)))) {
    *(ulong *)&J[-1].penaltyslot = uVar14 - 4;
    J->postproc = LJ_POST_FIXCOMP;
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_arith(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_cts(J->L);
  MMS mm = (MMS)rd->data;
  TRef sp[2];
  CType *s[2];
  MSize i;
  for (i = 0; i < 2; i++) {
    TRef tr = J->base[i];
    CType *ct = ctype_get(cts, CTID_DOUBLE);
    if (!tr) {
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    } else if (tref_iscdata(tr)) {
      CTypeID id = argv2cdata(J, tr, &rd->argv[i])->ctypeid;
      IRType t;
      ct = ctype_raw(cts, id);
      t = crec_ct2irt(cts, ct);
      if (ctype_isptr(ct->info)) {  /* Resolve pointer or reference. */
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_PTR);
	if (ctype_isref(ct->info)) {
	  ct = ctype_rawchild(cts, ct);
	  t = crec_ct2irt(cts, ct);
	}
      } else if (t == IRT_I64 || t == IRT_U64) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT64);
	lj_needsplit(J);
	goto ok;
      } else if (t == IRT_INT || t == IRT_U32) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT);
	if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
	goto ok;
      } else if (ctype_isfunc(ct->info)) {
	CTypeID id0 = i ? ctype_typeid(cts, s[0]) : 0;
	tr = emitir(IRT(IR_FLOAD, IRT_PTR), tr, IRFL_CDATA_PTR);
	ct = ctype_get(cts,
	  lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|id), CTSIZE_PTR));
	if (i) {
	  s[0] = ctype_get(cts, id0);  /* cts->tab may have been reallocated. */
	}
	goto ok;
      } else {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCcdata)));
      }
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info)) {
	if (t == IRT_CDATA) {
	  tr = 0;
	} else {
	  if (t == IRT_I64 || t == IRT_U64) lj_needsplit(J);
	  tr = emitir(IRT(IR_XLOAD, t), tr, 0);
	}
      }
    } else if (tref_isnil(tr)) {
      if (!(mm == MM_len || mm == MM_eq || mm == MM_lt || mm == MM_le))
	lj_trace_err(J, LJ_TRERR_BADTYPE);
      tr = lj_ir_kptr(J, NULL);
      ct = ctype_get(cts, CTID_P_VOID);
    } else if (tref_isinteger(tr)) {
      ct = ctype_get(cts, CTID_INT32);
    } else if (tref_isstr(tr)) {
      TRef tr2 = J->base[1-i];
      CTypeID id = argv2cdata(J, tr2, &rd->argv[1-i])->ctypeid;
      ct = ctype_raw(cts, id);
      if (ctype_isenum(ct->info)) {  /* Match string against enum constant. */
	GCstr *str = strV(&rd->argv[i]);
	CTSize ofs;
	CType *cct = lj_ctype_getfield(cts, ct, str, &ofs);
	if (cct && ctype_isconstval(cct->info)) {
	  /* Specialize to the name of the enum constant. */
	  emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, str));
	  ct = ctype_child(cts, cct);
	  tr = lj_ir_kint(J, (int32_t)ofs);
	} else {  /* Interpreter will throw or return false. */
	  lj_trace_err(J, LJ_TRERR_BADTYPE);
	}
      } else if (ctype_isptr(ct->info)) {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCstr)));
      } else {
	lj_trace_err(J, LJ_TRERR_BADTYPE);
      }
    } else if (!tref_isnum(tr)) {
      tr = 0;
      ct = ctype_get(cts, CTID_P_VOID);
    }
  ok:
    s[i] = ct;
    sp[i] = tr;
  }
  {
    TRef tr;
    if ((mm == MM_len || mm == MM_concat ||
	 (!(tr = crec_arith_int64(J, sp, s, mm)) &&
	  !(tr = crec_arith_ptr(J, sp, s, mm)))) &&
	!(tr = crec_arith_meta(J, sp, s, cts, rd)))
      return;
    J->base[0] = tr;
    /* Fixup cdata comparisons, too. Avoids some cdata escapes. */
    if (J->postproc == LJ_POST_FIXGUARD && frame_iscont(J->L->base-1) &&
	!irt_isguard(J->guardemit)) {
      const BCIns *pc = frame_contpc(J->L->base-1) - 1;
      if (bc_op(*pc) <= BC_ISNEP) {
	J2G(J)->tmptv.u64 = (uint64_t)(uintptr_t)pc;
	J->postproc = LJ_POST_FIXCOMP;
      }
    }
  }
}